

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding-hash.cc
# Opt level: O0

void __thiscall
wabt::BindingHash::SortDuplicatesVectorByLocation(BindingHash *this,ValueTypeVector *duplicates)

{
  iterator iVar1;
  iterator iVar2;
  ValueTypeVector *duplicates_local;
  BindingHash *this_local;
  
  iVar1 = std::
          vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
          ::begin(duplicates);
  iVar2 = std::
          vector<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*,_std::allocator<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_*>_>
          ::end(duplicates);
  std::
  sort<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::string_const,wabt::Binding>const**,std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>>,wabt::BindingHash::SortDuplicatesVectorByLocation(std::vector<std::pair<std::__cxx11::string_const,wabt::Binding>const*,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>const*>>*)const::__0>
            (iVar1._M_current,iVar2._M_current);
  return;
}

Assistant:

void BindingHash::SortDuplicatesVectorByLocation(
    ValueTypeVector* duplicates) const {
  std::sort(
      duplicates->begin(), duplicates->end(),
      [](const value_type* lhs, const value_type* rhs) -> bool {
        return lhs->second.loc.line < rhs->second.loc.line ||
               (lhs->second.loc.line == rhs->second.loc.line &&
                lhs->second.loc.first_column < rhs->second.loc.first_column);
      });
}